

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void Assimp::IFC::ConvertColor
               (aiColor4D *out,IfcColourOrFactor *in,ConversionData *conv,aiColor4D *base)

{
  PrimitiveDataType<double> *this;
  double *pdVar1;
  IfcColourRgb *in_00;
  float fVar2;
  IfcColourRgb *rgb;
  REAL *r;
  aiColor4D *base_local;
  ConversionData *conv_local;
  IfcColourOrFactor *in_local;
  aiColor4D *out_local;
  
  this = STEP::EXPRESS::DataType::ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>(in);
  if (this == (PrimitiveDataType<double> *)0x0) {
    in_00 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcColourRgb>
                      (in,conv->db);
    if (in_00 == (IfcColourRgb *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogWarn("skipping unknown IfcColourOrFactor entity");
    }
    else {
      ConvertColor(out,in_00);
    }
  }
  else {
    pdVar1 = STEP::EXPRESS::PrimitiveDataType::operator_cast_to_double_((PrimitiveDataType *)this);
    fVar2 = (float)*pdVar1;
    out->b = fVar2;
    out->g = fVar2;
    out->r = fVar2;
    if (base == (aiColor4D *)0x0) {
      out->a = 1.0;
    }
    else {
      out->r = base->r * out->r;
      out->g = base->g * out->g;
      out->b = base->b * out->b;
      out->a = base->a;
    }
  }
  return;
}

Assistant:

void ConvertColor(aiColor4D& out, const Schema_2x3::IfcColourOrFactor& in,ConversionData& conv,const aiColor4D* base)
{
    if (const ::Assimp::STEP::EXPRESS::REAL* const r = in.ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
        out.r = out.g = out.b = static_cast<float>(*r);
        if(base) {
            out.r *= static_cast<float>( base->r );
            out.g *= static_cast<float>( base->g );
            out.b *= static_cast<float>( base->b );
            out.a = static_cast<float>( base->a );
        }
        else out.a = 1.0;
    }
    else if (const Schema_2x3::IfcColourRgb* const rgb = in.ResolveSelectPtr<Schema_2x3::IfcColourRgb>(conv.db)) {
        ConvertColor(out,*rgb);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcColourOrFactor entity");
    }
}